

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O2

void __thiscall File::setTextInRange(File *this,Range *oldRange,u16string *text)

{
  TSPoint TVar1;
  TSPoint TVar2;
  TSPoint TVar3;
  uint32_t uVar4;
  ClipResult CVar5;
  u16string oldText;
  u16string local_78;
  TSInputEdit local_54;
  
  if (this->hasParser == true) {
    CVar5 = TextBuffer::clip_position(&this->buffer,oldRange->start);
    uVar4 = CVar5.offset;
    TextBuffer::text_in_range_abi_cxx11_(&local_78,&this->buffer,*oldRange);
    TVar1 = toTSPoint(oldRange->start);
    TVar2 = toTSPoint(oldRange->end);
    TVar3 = TSEndPointOfText(text);
    local_54.start_point.column = TVar1.column;
    local_54.new_end_point.column = 0;
    if (TVar3.row == 0) {
      local_54.new_end_point.column = local_54.start_point.column;
    }
    local_54.new_end_point.column = local_54.new_end_point.column + TVar3.column;
    local_54.start_point.row = TVar1.row;
    local_54.new_end_point.row = TVar3.row + local_54.start_point.row;
    local_54.old_end_byte = ((int)local_78._M_string_length + uVar4) * 2;
    local_54.new_end_byte = ((int)text->_M_string_length + uVar4) * 2;
    local_54.start_byte = uVar4 * 2;
    local_54.old_end_point = TVar2;
    ts_tree_edit(this->tree,&local_54);
    std::__cxx11::u16string::~u16string((u16string *)&local_78);
  }
  TextBuffer::set_text_in_range(&this->buffer,*oldRange,text);
  if (this->hasParser == true) {
    executeParse(this);
  }
  return;
}

Assistant:

void File::setTextInRange (Range &oldRange, std::u16string &&text) {
    if (hasParser) {
        uint32_t startByte = buffer.clip_position(oldRange.start).offset << 1;

        u16string oldText = buffer.text_in_range(oldRange);

        TSPoint start = toTSPoint(oldRange.start);
        TSPoint end = toTSPoint(oldRange.end);

        TSPoint newEndPoint = TSEndPointOfText(text);

        if (newEndPoint.row == 0) {
            newEndPoint.column += start.column;
        }

        newEndPoint.row += start.row;

        TSInputEdit edit = {
                startByte, // start byte
                startByte + (static_cast<uint32_t>(oldText.length()) << 1), // old end byte
                startByte + (static_cast<uint32_t>(text.length()) << 1), // new end byte
                start, // start point
                end, // old end point
                newEndPoint // new end point
        };

//        std::cerr << "TSEDIT\n";
//        std::cerr << "old text: " << UtfHandler().utf16to8(oldText) << "\n";
//        std::cerr << "new text: " << UtfHandler().utf16to8(text) << "\n";
//        std::cerr << "startByte: " << startByte << "\n";
//        std::cerr << "old end byte: " << edit.old_end_byte << "\n";
//        std::cerr << "new end byte: " << edit.new_end_byte << "\n";
//        std::cerr << "start point: " << edit.start_point.row << ":" << edit.start_point.column << "\n";
//        std::cerr << "old end point: " << edit.old_end_point.row << ":" << edit.old_end_point.column << "\n";
//        std::cerr << "new end point: " << edit.new_end_point.row << ":" << edit.new_end_point.column << "\n";

        ts_tree_edit(tree, &edit);
    }

    buffer.set_text_in_range(oldRange, move(text));

    if (hasParser) {
        executeParse();
    }
}